

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void markold(global_State *g,GCObject *from,GCObject *to)

{
  byte bVar1;
  
  for (; from != to; from = from->next) {
    bVar1 = from->marked;
    if (((bVar1 & 7) == 3) && (from->marked = bVar1 & 0xf8 | 4, (bVar1 & 0x20) != 0)) {
      reallymarkobject(g,from);
    }
  }
  return;
}

Assistant:

static void markold (global_State *g, GCObject *from, GCObject *to) {
  GCObject *p;
  for (p = from; p != to; p = p->next) {
    if (getage(p) == G_OLD1) {
      lua_assert(!iswhite(p));
      setage(p, G_OLD);  /* now they are old */
      if (isblack(p))
        reallymarkobject(g, p);
    }
  }
}